

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O3

ByteData * __thiscall
cfd::core::MerkleBlock::Serialize(ByteData *__return_storage_ptr__,MerkleBlock *this)

{
  pointer pTVar1;
  _Bit_type *p_Var2;
  ulong uVar3;
  ulong uVar4;
  Txid *txid;
  pointer this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ret;
  Serializer obj;
  ByteData bits;
  allocator_type local_89;
  ByteData local_88;
  Serializer local_70;
  ByteData local_48;
  
  Serializer::Serializer(&local_70);
  Serializer::AddDirectNumber(&local_70,(uint32_t)this->transaction_count);
  Serializer::AddVariableInt
            (&local_70,
             (long)(this->txids_).
                   super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->txids_).
                   super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
                   super__Vector_impl_data._M_start >> 5);
  this_00 = (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pTVar1 = (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pTVar1) {
    do {
      Txid::GetData(&local_88,this_00);
      Serializer::AddDirectBytes(&local_70,&local_88);
      if (local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pTVar1);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_88.data_,
             (long)(this->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p +
             (((ulong)(this->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset + 7 >> 3
              ) - (long)(this->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) &
             0x1fffffffffffffff,&local_89);
  p_Var2 = (this->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
           ._M_start.super__Bit_iterator_base._M_p;
  if (((long)(this->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var2) * 8 +
      (ulong)(this->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset != 0) {
    uVar3 = 0;
    do {
      uVar4 = uVar3 + 0x3f;
      if (-1 < (long)uVar3) {
        uVar4 = uVar3;
      }
      local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3 >> 3] =
           local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start[uVar3 >> 3] |
           ((p_Var2[((long)uVar4 >> 6) +
                    (ulong)((uVar3 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff]
             >> (uVar3 & 0x3f) & 1) != 0) << ((byte)uVar3 & 7);
      uVar3 = uVar3 + 1;
      p_Var2 = (this->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    } while (uVar3 < (ulong)(this->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                     ((long)(this->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                     (long)p_Var2) * 8);
  }
  ByteData::ByteData(&local_48,&local_88.data_);
  if (local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  Serializer::AddVariableBuffer(&local_70,&local_48);
  Serializer::Output(__return_storage_ptr__,&local_70);
  if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_70._vptr_Serializer = (_func_int **)&PTR__Serializer_0067a778;
  if (local_70.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData MerkleBlock::Serialize() const {
  Serializer obj;
  obj.AddDirectNumber(static_cast<uint32_t>(transaction_count));
  obj.AddVariableInt(txids_.size());
  for (const auto& txid : txids_) {
    obj.AddDirectBytes(txid.GetData());
  }
  auto bits = BitsToBytes(bits_);
  obj.AddVariableBuffer(bits);
  return obj.Output();
}